

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_serializer_boost_po.h
# Opt level: O0

void __thiscall
VW::config::options_serializer_boost_po::serialize<int>
          (options_serializer_boost_po *this,
          typed_option<std::vector<int,_std::allocator<int>_>_> *typed_option)

{
  bool bVar1;
  size_type sVar2;
  reference piVar3;
  ostream *poVar4;
  long in_RSI;
  vector<int,_std::allocator<int>_> *in_RDI;
  int *value;
  iterator __end0;
  iterator __begin0;
  vector<int,_std::allocator<int>_> *__range4;
  vector<int,_std::allocator<int>_> vec;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff88;
  ostream *in_stack_ffffffffffffff90;
  typed_option<std::vector<int,_std::allocator<int>_>_> *in_stack_ffffffffffffff98;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_38;
  vector<int,_std::allocator<int>_> *local_30;
  vector<int,_std::allocator<int>_> local_28;
  long local_10;
  
  local_10 = in_RSI;
  typed_option<std::vector<int,_std::allocator<int>_>_>::value(in_stack_ffffffffffffff98);
  sVar2 = std::vector<int,_std::allocator<int>_>::size(&local_28);
  if (sVar2 != 0) {
    local_30 = &local_28;
    local_38._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff88);
    std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffff88);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                              in_stack_ffffffffffffff90,
                              (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                              in_stack_ffffffffffffff88), bVar1) {
      piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_38);
      poVar4 = std::operator<<((ostream *)(in_RDI + 1)," --");
      std::operator<<(poVar4,(string *)(local_10 + 8));
      in_stack_ffffffffffffff90 = std::operator<<((ostream *)(in_RDI + 1)," ");
      std::ostream::operator<<(in_stack_ffffffffffffff90,*piVar3);
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&local_38);
    }
  }
  std::vector<int,_std::allocator<int>_>::~vector(in_RDI);
  return;
}

Assistant:

void serialize(typed_option<std::vector<T>>& typed_option)
  {
    auto vec = typed_option.value();
    if (vec.size() > 0)
    {
      for (auto const& value : vec)
      {
        m_output_stream << " --" << typed_option.m_name;
        m_output_stream << " " << value;
      }
    }
  }